

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

size_t ma_dr_wav__write_or_count_metadata
                 (ma_dr_wav *pWav,ma_dr_wav_metadata *pMetadatas,ma_uint32 metadataCount)

{
  ma_dr_wav_metadata_type mVar1;
  int iVar2;
  ma_uint64 mVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  ulong uVar13;
  ma_dr_wav_write_proc p_Var14;
  size_t sVar15;
  ma_uint32 *pmVar16;
  size_t sVar17;
  size_t sVar18;
  size_t sVar19;
  size_t sVar20;
  size_t sVar21;
  size_t sVar22;
  ma_uint32 mVar23;
  char **ppcVar24;
  char *pcVar25;
  void *pvVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  ulong local_f0;
  uint local_e8 [46];
  
  bVar6 = false;
  if (metadataCount == 0 || pMetadatas == (ma_dr_wav_metadata *)0x0) {
    sVar10 = 0;
  }
  else {
    uVar30 = (ulong)metadataCount;
    uVar29 = 0;
    sVar10 = 0;
    bVar4 = false;
    do {
      mVar1 = pMetadatas[uVar29].type;
      bVar5 = true;
      if (((mVar1 & ma_dr_wav_metadata_type_list_all_info_strings) == ma_dr_wav_metadata_type_none)
         && (bVar5 = bVar4, mVar1 == ma_dr_wav_metadata_type_unknown)) {
        mVar23 = pMetadatas[uVar29].data.smpl.productId;
        if (mVar23 == 2) {
          bVar4 = true;
        }
LAB_0016453d:
        if (mVar23 == 3) {
          bVar6 = true;
        }
LAB_00164571:
        if (mVar23 == 1) {
          uVar28 = pMetadatas[uVar29].data.smpl.samplePeriodNanoseconds;
          local_f0 = (ulong)uVar28;
          if (pWav == (ma_dr_wav *)0x0) {
            lVar31 = sVar10 + 8;
            sVar10 = local_f0;
          }
          else {
            sVar8 = (*pWav->onWrite)(pWav->pUserData,&pMetadatas[uVar29].data,4);
            local_e8[0] = uVar28;
            sVar9 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
            lVar31 = sVar10 + sVar9 + sVar8;
            sVar10 = (*pWav->onWrite)(pWav->pUserData,
                                      pMetadatas[uVar29].data.bext.pOriginatorReference,
                                      (ulong)pMetadatas[uVar29].data.smpl.samplePeriodNanoseconds);
          }
          sVar10 = lVar31 + sVar10;
          goto LAB_00165113;
        }
switchD_0016456c_caseD_3:
      }
      else {
        bVar7 = true;
        bVar4 = bVar5;
        if (((mVar1 & ma_dr_wav_metadata_type_list_all_adtl) == ma_dr_wav_metadata_type_none) &&
           (bVar7 = bVar6, mVar1 == ma_dr_wav_metadata_type_unknown)) {
          mVar23 = pMetadatas[uVar29].data.smpl.productId;
          goto LAB_0016453d;
        }
        bVar6 = bVar7;
        switch(mVar1) {
        case ma_dr_wav_metadata_type_unknown:
          mVar23 = pMetadatas[uVar29].data.smpl.productId;
          goto LAB_00164571;
        case ma_dr_wav_metadata_type_smpl:
          uVar28 = pMetadatas[uVar29].data.smpl.sampleLoopCount;
          uVar27 = pMetadatas[uVar29].data.smpl.samplerSpecificDataSizeInBytes + uVar28 * 0x18 +
                   0x24;
          local_f0 = (ulong)uVar27;
          if (pWav == (ma_dr_wav *)0x0) {
            lVar31 = sVar10 + 0x28;
            sVar10 = 4;
          }
          else {
            sVar8 = (*pWav->onWrite)(pWav->pUserData,"smpl",4);
            local_e8[0] = uVar27;
            sVar9 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
            local_e8[0] = pMetadatas[uVar29].data.cue.cuePointCount;
            sVar15 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
            local_e8[0] = pMetadatas[uVar29].data.smpl.productId;
            sVar17 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
            local_e8[0] = pMetadatas[uVar29].data.smpl.samplePeriodNanoseconds;
            sVar18 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
            local_e8[0] = pMetadatas[uVar29].data.smpl.midiUnityNote;
            sVar19 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
            local_e8[0] = pMetadatas[uVar29].data.smpl.midiPitchFraction;
            sVar20 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
            local_e8[0] = pMetadatas[uVar29].data.smpl.smpteFormat;
            sVar21 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
            local_e8[0] = pMetadatas[uVar29].data.smpl.smpteOffset;
            sVar22 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
            local_e8[0] = pMetadatas[uVar29].data.smpl.sampleLoopCount;
            sVar11 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
            lVar31 = sVar11 + sVar22 + sVar21 + sVar20 + sVar19 +
                     sVar18 + sVar17 + sVar15 + sVar10 + sVar9 + sVar8;
            local_e8[0] = pMetadatas[uVar29].data.smpl.samplerSpecificDataSizeInBytes;
            sVar10 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
            uVar28 = pMetadatas[uVar29].data.smpl.sampleLoopCount;
          }
          sVar10 = lVar31 + sVar10;
          if (uVar28 != 0) {
            lVar31 = 0;
            uVar13 = 0;
            do {
              if (pWav == (ma_dr_wav *)0x0) {
                lVar32 = sVar10 + 0x14;
                sVar10 = 4;
              }
              else {
                local_e8[0] = *(uint *)((long)&(pMetadatas[uVar29].data.smpl.pLoops)->cuePointId +
                                       lVar31);
                sVar8 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
                local_e8[0] = *(uint *)((long)&(pMetadatas[uVar29].data.smpl.pLoops)->type + lVar31)
                ;
                sVar9 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
                local_e8[0] = *(uint *)((long)&(pMetadatas[uVar29].data.smpl.pLoops)->
                                               firstSampleByteOffset + lVar31);
                sVar15 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
                local_e8[0] = *(uint *)((long)&(pMetadatas[uVar29].data.smpl.pLoops)->
                                               lastSampleByteOffset + lVar31);
                sVar17 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
                local_e8[0] = *(uint *)((long)&(pMetadatas[uVar29].data.smpl.pLoops)->sampleFraction
                                       + lVar31);
                sVar18 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
                lVar32 = sVar18 + sVar17 + sVar15 + sVar9 + sVar8 + sVar10;
                local_e8[0] = *(uint *)((long)&(pMetadatas[uVar29].data.smpl.pLoops)->playCount +
                                       lVar31);
                sVar10 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
                uVar28 = pMetadatas[uVar29].data.smpl.sampleLoopCount;
              }
              sVar10 = lVar32 + sVar10;
              uVar13 = uVar13 + 1;
              lVar31 = lVar31 + 0x18;
            } while (uVar13 < uVar28);
          }
          uVar13 = (ulong)pMetadatas[uVar29].data.smpl.samplerSpecificDataSizeInBytes;
          if (uVar13 != 0) {
            if (pWav != (ma_dr_wav *)0x0) {
              uVar13 = (*pWav->onWrite)(pWav->pUserData,
                                        pMetadatas[uVar29].data.smpl.pSamplerSpecificData,uVar13);
            }
            goto LAB_00165110;
          }
          break;
        case ma_dr_wav_metadata_type_smpl|ma_dr_wav_metadata_type_unknown:
        case ma_dr_wav_metadata_type_inst|ma_dr_wav_metadata_type_unknown:
        case ma_dr_wav_metadata_type_inst|ma_dr_wav_metadata_type_smpl:
        case ma_dr_wav_metadata_type_inst|ma_dr_wav_metadata_type_smpl|
             ma_dr_wav_metadata_type_unknown:
          goto switchD_0016456c_caseD_3;
        case ma_dr_wav_metadata_type_inst:
          if (pWav == (ma_dr_wav *)0x0) {
            lVar31 = sVar10 + 0xe;
            sVar10 = 1;
          }
          else {
            sVar8 = (*pWav->onWrite)(pWav->pUserData,"inst",4);
            local_e8[0] = 7;
            sVar9 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
            sVar15 = (*pWav->onWrite)(pWav->pUserData,&pMetadatas[uVar29].data,1);
            sVar17 = (*pWav->onWrite)(pWav->pUserData,(void *)((long)&pMetadatas[uVar29].data + 1),1
                                     );
            sVar18 = (*pWav->onWrite)(pWav->pUserData,(void *)((long)&pMetadatas[uVar29].data + 2),1
                                     );
            sVar19 = (*pWav->onWrite)(pWav->pUserData,(void *)((long)&pMetadatas[uVar29].data + 3),1
                                     );
            sVar20 = (*pWav->onWrite)(pWav->pUserData,(void *)((long)&pMetadatas[uVar29].data + 4),1
                                     );
            sVar21 = (*pWav->onWrite)(pWav->pUserData,(void *)((long)&pMetadatas[uVar29].data + 5),1
                                     );
            lVar31 = sVar21 + sVar20 + sVar19 + sVar18 + sVar17 + sVar15 + sVar10 + sVar9 + sVar8;
            sVar10 = (*pWav->onWrite)(pWav->pUserData,(void *)((long)&pMetadatas[uVar29].data + 6),1
                                     );
          }
          sVar10 = lVar31 + sVar10;
          goto LAB_00165124;
        case ma_dr_wav_metadata_type_cue:
          uVar28 = pMetadatas[uVar29].data.cue.cuePointCount;
          local_f0 = 0;
          if (pWav == (ma_dr_wav *)0x0) {
            lVar31 = sVar10 + 8;
            sVar10 = 4;
          }
          else {
            sVar8 = (*pWav->onWrite)(pWav->pUserData,"cue ",4);
            local_e8[0] = uVar28 * 0x18 + 4;
            sVar9 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
            lVar31 = sVar10 + sVar9 + sVar8;
            local_e8[0] = pMetadatas[uVar29].data.cue.cuePointCount;
            sVar10 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
            uVar28 = pMetadatas[uVar29].data.cue.cuePointCount;
          }
          sVar10 = lVar31 + sVar10;
          if (uVar28 != 0) {
            lVar31 = 0;
            uVar13 = 0;
            do {
              if (pWav == (ma_dr_wav *)0x0) {
                lVar32 = sVar10 + 0x14;
                sVar10 = 4;
              }
              else {
                local_e8[0] = *(uint *)((pMetadatas[uVar29].data.cue.pCuePoints)->dataChunkId +
                                       lVar31 + -8);
                sVar8 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
                local_e8[0] = *(uint *)((pMetadatas[uVar29].data.cue.pCuePoints)->dataChunkId +
                                       lVar31 + -4);
                sVar9 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
                sVar15 = (*pWav->onWrite)(pWav->pUserData,
                                          (pMetadatas[uVar29].data.cue.pCuePoints)->dataChunkId +
                                          lVar31,4);
                local_e8[0] = *(uint *)((pMetadatas[uVar29].data.cue.pCuePoints)->dataChunkId +
                                       lVar31 + 4);
                sVar17 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
                local_e8[0] = *(uint *)((pMetadatas[uVar29].data.cue.pCuePoints)->dataChunkId +
                                       lVar31 + 8);
                sVar18 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
                lVar32 = sVar18 + sVar17 + sVar9 + sVar8 + sVar10 + sVar15;
                local_e8[0] = *(uint *)((pMetadatas[uVar29].data.cue.pCuePoints)->dataChunkId +
                                       lVar31 + 0xc);
                sVar10 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
                uVar28 = pMetadatas[uVar29].data.cue.cuePointCount;
              }
              sVar10 = lVar32 + sVar10;
              uVar13 = uVar13 + 1;
              lVar31 = lVar31 + 0x18;
            } while (uVar13 < uVar28);
          }
          break;
        default:
          if (mVar1 != ma_dr_wav_metadata_type_acid) {
            if (mVar1 == ma_dr_wav_metadata_type_bext) {
              uVar28 = pMetadatas[uVar29].data.bext.codingHistorySize + 0x25a;
              local_f0 = (ulong)uVar28;
              if (pWav == (ma_dr_wav *)0x0) {
                sVar8 = 4;
                sVar9 = 4;
              }
              else {
                sVar8 = (*pWav->onWrite)(pWav->pUserData,"bext",4);
                local_e8[0] = uVar28;
                sVar9 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
              }
              lVar31 = sVar8 + sVar10 + sVar9;
              ma_dr_wav__write_or_count_string_to_fixed_size_buf
                        (pWav,pMetadatas[uVar29].data.bext.pDescription,0x100);
              ma_dr_wav__write_or_count_string_to_fixed_size_buf
                        (pWav,pMetadatas[uVar29].data.bext.pOriginatorName,0x20);
              ma_dr_wav__write_or_count_string_to_fixed_size_buf
                        (pWav,pMetadatas[uVar29].data.bext.pOriginatorReference,0x20);
              if (pWav == (ma_dr_wav *)0x0) {
                sVar10 = lVar31 + 0x25a;
                uVar13 = (ulong)pMetadatas[uVar29].data.bext.codingHistorySize;
                if (uVar13 != 0) {
LAB_00165110:
                  sVar10 = sVar10 + uVar13;
                }
              }
              else {
                sVar10 = (*pWav->onWrite)(pWav->pUserData,
                                          (void *)((long)&pMetadatas[uVar29].data + 0x18),10);
                sVar8 = (*pWav->onWrite)(pWav->pUserData,
                                         (void *)((long)&pMetadatas[uVar29].data + 0x22),8);
                mVar3 = pMetadatas[uVar29].data.bext.timeReference;
                local_e8[0] = (uint)mVar3;
                sVar9 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
                local_e8[0] = (uint)(mVar3 >> 0x20);
                sVar15 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
                local_e8[0]._0_2_ = pMetadatas[uVar29].data.bext.version;
                sVar17 = (*pWav->onWrite)(pWav->pUserData,local_e8,2);
                sVar18 = (*pWav->onWrite)(pWav->pUserData,pMetadatas[uVar29].data.bext.pUMID,0x40);
                local_e8[0]._0_2_ = pMetadatas[uVar29].data.bext.loudnessValue;
                sVar19 = (*pWav->onWrite)(pWav->pUserData,local_e8,2);
                local_e8[0]._0_2_ = pMetadatas[uVar29].data.bext.loudnessRange;
                sVar20 = (*pWav->onWrite)(pWav->pUserData,local_e8,2);
                local_e8[0]._0_2_ = pMetadatas[uVar29].data.bext.maxTruePeakLevel;
                sVar21 = (*pWav->onWrite)(pWav->pUserData,local_e8,2);
                local_e8[0]._0_2_ = pMetadatas[uVar29].data.bext.maxMomentaryLoudness;
                sVar22 = (*pWav->onWrite)(pWav->pUserData,local_e8,2);
                local_e8[0] = CONCAT22(local_e8[0]._2_2_,
                                       pMetadatas[uVar29].data.bext.maxShortTermLoudness);
                sVar11 = (*pWav->onWrite)(pWav->pUserData,local_e8,2);
                memset(local_e8,0,0xb4);
                sVar12 = (*pWav->onWrite)(pWav->pUserData,local_e8,0xb4);
                sVar10 = sVar12 + sVar11 + sVar22 + sVar21 + sVar20 +
                                  sVar19 + sVar17 + sVar15 + sVar9 + sVar8 + lVar31 + sVar10 +
                                  sVar18 + 0x140;
                uVar13 = (ulong)pMetadatas[uVar29].data.bext.codingHistorySize;
                if (uVar13 != 0) {
                  uVar13 = (*pWav->onWrite)(pWav->pUserData,
                                            pMetadatas[uVar29].data.bext.pCodingHistory,uVar13);
                  goto LAB_00165110;
                }
              }
              break;
            }
            goto switchD_0016456c_caseD_3;
          }
          if (pWav != (ma_dr_wav *)0x0) {
            sVar8 = (*pWav->onWrite)(pWav->pUserData,"acid",4);
            local_e8[0] = 0x18;
            sVar9 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
            local_e8[0] = pMetadatas[uVar29].data.cue.cuePointCount;
            sVar15 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
            local_e8[0]._0_2_ = pMetadatas[uVar29].data.acid.midiUnityNote;
            sVar17 = (*pWav->onWrite)(pWav->pUserData,local_e8,2);
            local_e8[0] = CONCAT22(local_e8[0]._2_2_,pMetadatas[uVar29].data.acid.reserved1);
            sVar18 = (*pWav->onWrite)(pWav->pUserData,local_e8,2);
            local_e8[0] = pMetadatas[uVar29].data.smpl.samplePeriodNanoseconds;
            sVar19 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
            local_e8[0] = pMetadatas[uVar29].data.smpl.midiUnityNote;
            sVar20 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
            local_e8[0]._0_2_ = pMetadatas[uVar29].data.acid.meterDenominator;
            sVar21 = (*pWav->onWrite)(pWav->pUserData,local_e8,2);
            local_e8[0] = CONCAT22(local_e8[0]._2_2_,pMetadatas[uVar29].data.acid.meterNumerator);
            sVar22 = (*pWav->onWrite)(pWav->pUserData,local_e8,2);
            sVar10 = sVar22 + sVar21 + sVar20 + sVar19 +
                     sVar18 + sVar17 + sVar15 + sVar10 + sVar9 + sVar8;
            local_e8[0] = pMetadatas[uVar29].data.smpl.smpteFormat;
            p_Var14 = pWav->onWrite;
            pvVar26 = pWav->pUserData;
            sVar8 = 4;
            goto LAB_00165140;
          }
          sVar10 = sVar10 + 0x1c;
          sVar8 = 4;
          goto LAB_00165149;
        }
LAB_00165113:
        bVar5 = bVar4;
        bVar7 = bVar6;
        if ((local_f0 & 1) != 0) {
LAB_00165124:
          if (pWav == (ma_dr_wav *)0x0) {
            sVar8 = 1;
          }
          else {
            p_Var14 = pWav->onWrite;
            pvVar26 = pWav->pUserData;
            local_e8[0] = local_e8[0] & 0xffffff00;
            sVar8 = 1;
LAB_00165140:
            sVar8 = (*p_Var14)(pvVar26,local_e8,sVar8);
          }
LAB_00165149:
          sVar10 = sVar10 + sVar8;
          bVar4 = bVar5;
          bVar6 = bVar7;
          goto switchD_0016456c_caseD_3;
        }
      }
      uVar29 = uVar29 + 1;
    } while (uVar29 != uVar30);
    if (bVar4) {
      uVar28 = 4;
      lVar31 = 0;
      do {
        uVar27 = *(uint *)((long)&pMetadatas->type + lVar31);
        if ((uVar27 & 0x3fe00) == 0) {
          if ((uVar27 == 1) && (*(int *)((long)&pMetadatas->data + lVar31 + 4) == 2)) {
            uVar28 = uVar28 + *(int *)((long)&pMetadatas->data + lVar31 + 8) + 8;
          }
        }
        else {
          uVar28 = uVar28 + *(int *)((long)&pMetadatas->data + lVar31) + 9;
        }
        uVar28 = (uVar28 & 1) + uVar28;
        lVar31 = lVar31 + 0x70;
      } while (uVar30 * 0x70 - lVar31 != 0);
      if (pWav == (ma_dr_wav *)0x0) {
        lVar31 = sVar10 + 8;
        sVar10 = 4;
      }
      else {
        sVar8 = (*pWav->onWrite)(pWav->pUserData,"LIST",4);
        local_e8[0] = uVar28;
        sVar9 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
        lVar31 = sVar10 + sVar9 + sVar8;
        sVar10 = (*pWav->onWrite)(pWav->pUserData,"INFO",4);
      }
      sVar10 = lVar31 + sVar10;
      ppcVar24 = &(pMetadatas->data).bext.pOriginatorReference;
      uVar29 = uVar30;
      do {
        uVar28 = *(uint *)(ppcVar24 + -3);
        if ((uVar28 & 0x3fe00) == 0) {
          if (((uVar28 == 1) && (*(int *)((long)ppcVar24 + -0xc) == 2)) &&
             (uVar13 = (ulong)*(uint *)(ppcVar24 + -1), uVar13 != 0)) {
            if (pWav == (ma_dr_wav *)0x0) {
              lVar31 = sVar10 + 8;
              sVar10 = uVar13;
            }
            else {
              sVar8 = (*pWav->onWrite)(pWav->pUserData,(ma_dr_wav_bext *)(ppcVar24 + -2),4);
              local_e8[0] = *(uint *)(ppcVar24 + -1);
              sVar9 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
              lVar31 = sVar10 + sVar9 + sVar8;
              sVar10 = (*pWav->onWrite)(pWav->pUserData,*ppcVar24,uVar13);
            }
            goto LAB_00165422;
          }
        }
        else {
          if ((int)uVar28 < 0x2000) {
            if ((int)uVar28 < 0x800) {
              if (uVar28 == 0x200) {
                pcVar25 = "ISFT";
              }
              else {
                pcVar25 = (char *)0x0;
                if (uVar28 == 0x400) {
                  pcVar25 = "ICOP";
                }
              }
            }
            else if (uVar28 == 0x800) {
              pcVar25 = "INAM";
            }
            else {
              pcVar25 = (char *)0x0;
              if (uVar28 == 0x1000) {
                pcVar25 = "IART";
              }
            }
          }
          else if ((int)uVar28 < 0x8000) {
            if (uVar28 == 0x2000) {
              pcVar25 = "ICMT";
            }
            else {
              pcVar25 = (char *)0x0;
              if (uVar28 == 0x4000) {
                pcVar25 = "ICRD";
              }
            }
          }
          else if (uVar28 == 0x8000) {
            pcVar25 = "IGNR";
          }
          else if (uVar28 == 0x10000) {
            pcVar25 = "IPRD";
          }
          else {
            pcVar25 = (char *)0x0;
            if (uVar28 == 0x20000) {
              pcVar25 = "ITRK";
            }
          }
          uVar28 = *(uint *)&((ma_dr_wav_bext *)(ppcVar24 + -2))->pDescription;
          if ((ulong)uVar28 != 0) {
            uVar13 = (ulong)(uVar28 + 1);
            if (pWav == (ma_dr_wav *)0x0) {
              lVar31 = sVar10 + uVar28 + 8;
              sVar10 = 1;
            }
            else {
              sVar8 = (*pWav->onWrite)(pWav->pUserData,pcVar25,4);
              local_e8[0] = uVar28 + 1;
              sVar9 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
              sVar15 = (*pWav->onWrite)(pWav->pUserData,ppcVar24[-1],
                                        (ulong)*(uint *)&((ma_dr_wav_bext *)(ppcVar24 + -2))->
                                                         pDescription);
              lVar31 = sVar10 + sVar9 + sVar8 + sVar15;
              local_e8[0] = local_e8[0] & 0xffffff00;
              sVar10 = (*pWav->onWrite)(pWav->pUserData,local_e8,1);
            }
LAB_00165422:
            sVar10 = lVar31 + sVar10;
            if ((uVar13 & 1) != 0) {
              if (pWav == (ma_dr_wav *)0x0) {
                sVar8 = 1;
              }
              else {
                local_e8[0] = local_e8[0] & 0xffffff00;
                sVar8 = (*pWav->onWrite)(pWav->pUserData,local_e8,1);
              }
              sVar10 = sVar10 + sVar8;
            }
          }
        }
        ppcVar24 = ppcVar24 + 0xe;
        uVar29 = uVar29 - 1;
      } while (uVar29 != 0);
    }
    if (bVar6) {
      pmVar16 = &(pMetadatas->data).smpl.smpteFormat;
      uVar28 = 4;
      uVar29 = uVar30;
      do {
        iVar2 = pmVar16[-7];
        if (iVar2 < 0x80) {
          if (iVar2 == 1) {
            if (pmVar16[-4] == 3) {
              uVar28 = uVar28 + pmVar16[-3] + 8;
            }
          }
          else if (iVar2 == 0x40) {
LAB_001654bb:
            if (pmVar16[-4] == 0) {
              uVar28 = uVar28 + 0xc;
            }
            else {
              uVar28 = uVar28 + pmVar16[-4] + 0xd;
            }
          }
        }
        else if (iVar2 == 0x100) {
          if (*pmVar16 == 0) {
            uVar28 = uVar28 + 0x1c;
          }
          else {
            uVar28 = uVar28 + *pmVar16 + 0x1d;
          }
        }
        else if (iVar2 == 0x80) goto LAB_001654bb;
        uVar28 = (uVar28 & 1) + uVar28;
        pmVar16 = pmVar16 + 0x1c;
        uVar29 = uVar29 - 1;
      } while (uVar29 != 0);
      if (pWav == (ma_dr_wav *)0x0) {
        lVar31 = sVar10 + 8;
        sVar10 = 4;
      }
      else {
        sVar8 = (*pWav->onWrite)(pWav->pUserData,"LIST",4);
        local_e8[0] = uVar28;
        sVar9 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
        lVar31 = sVar10 + sVar9 + sVar8;
        sVar10 = (*pWav->onWrite)(pWav->pUserData,"adtl",4);
      }
      sVar10 = lVar31 + sVar10;
      pmVar16 = &(pMetadatas->data).smpl.samplePeriodNanoseconds;
      do {
        uVar28 = pmVar16[-4];
        if ((int)uVar28 < 0x80) {
          if (uVar28 == 1) {
            if (pmVar16[-1] == 3) {
              uVar28 = *pmVar16;
              uVar29 = (ulong)uVar28;
              if (pWav == (ma_dr_wav *)0x0) {
                lVar31 = sVar10 + 8;
                sVar10 = uVar29;
              }
              else {
                sVar8 = (*pWav->onWrite)(pWav->pUserData,(ma_dr_wav_smpl *)(pmVar16 + -2),4);
                local_e8[0] = uVar28;
                sVar9 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
                lVar31 = sVar10 + sVar9 + sVar8;
                sVar10 = (*pWav->onWrite)(pWav->pUserData,*(void **)(pmVar16 + 2),uVar29);
              }
LAB_001658e1:
              sVar10 = lVar31 + sVar10;
LAB_001658e4:
              if ((uVar29 & 1) != 0) {
                if (pWav != (ma_dr_wav *)0x0) goto LAB_001658ef;
                sVar8 = 1;
                goto LAB_0016590d;
              }
            }
          }
          else if (uVar28 == 0x40) {
LAB_001655b2:
            uVar27 = pmVar16[-1];
            if ((ulong)uVar27 != 0) {
              if (pWav == (ma_dr_wav *)0x0) {
                uVar29 = (ulong)(uVar27 + 5);
                lVar31 = sVar10 + uVar27 + 0xc;
                sVar10 = 1;
              }
              else {
                pcVar25 = (char *)0x0;
                if (uVar28 == 0x80) {
                  pcVar25 = "note";
                }
                if (uVar28 == 0x40) {
                  pcVar25 = "labl";
                }
                sVar8 = (*pWav->onWrite)(pWav->pUserData,pcVar25,4);
                local_e8[0] = pmVar16[-1] + 5;
                uVar29 = (ulong)local_e8[0];
                sVar9 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
                local_e8[0] = ((ma_dr_wav_smpl *)(pmVar16 + -2))->manufacturerId;
                sVar15 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
                sVar17 = (*pWav->onWrite)(pWav->pUserData,*(void **)pmVar16,(ulong)pmVar16[-1]);
                lVar31 = sVar17 + sVar15 + sVar10 + sVar9 + sVar8;
                local_e8[0] = local_e8[0] & 0xffffff00;
                sVar10 = (*pWav->onWrite)(pWav->pUserData,local_e8,1);
              }
              goto LAB_001658e1;
            }
          }
        }
        else if (uVar28 == 0x100) {
          if (pWav == (ma_dr_wav *)0x0) {
            uVar28 = pmVar16[3];
            sVar10 = sVar10 + 0x1c;
            if ((ulong)uVar28 != 0) {
              uVar29 = (ulong)(uVar28 + 0x15);
              lVar31 = sVar10 + uVar28;
              sVar10 = 1;
              goto LAB_001658bf;
            }
          }
          else {
            sVar8 = (*pWav->onWrite)(pWav->pUserData,"ltxt",4);
            uVar29 = (ulong)(pmVar16[3] + 0x15);
            if (pmVar16[3] == 0) {
              uVar29 = 0x14;
            }
            local_e8[0] = (uint)uVar29;
            sVar9 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
            local_e8[0] = ((ma_dr_wav_smpl *)(pmVar16 + -2))->manufacturerId;
            sVar15 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
            local_e8[0] = pmVar16[-1];
            sVar17 = (*pWav->onWrite)(pWav->pUserData,local_e8,4);
            sVar18 = (*pWav->onWrite)(pWav->pUserData,pmVar16,4);
            local_e8[0]._0_2_ = (short)pmVar16[1];
            sVar19 = (*pWav->onWrite)(pWav->pUserData,local_e8,2);
            local_e8[0]._0_2_ = *(undefined2 *)((long)pmVar16 + 6);
            sVar20 = (*pWav->onWrite)(pWav->pUserData,local_e8,2);
            local_e8[0]._0_2_ = (ma_uint16)pmVar16[2];
            sVar21 = (*pWav->onWrite)(pWav->pUserData,local_e8,2);
            local_e8[0] = CONCAT22(local_e8[0]._2_2_,*(undefined2 *)((long)pmVar16 + 10));
            sVar22 = (*pWav->onWrite)(pWav->pUserData,local_e8,2);
            sVar10 = sVar22 + sVar21 + sVar20 +
                     sVar19 + sVar18 + sVar17 + sVar15 + sVar10 + sVar9 + sVar8;
            if ((ulong)pmVar16[3] != 0) {
              sVar8 = (*pWav->onWrite)(pWav->pUserData,*(void **)(pmVar16 + 4),(ulong)pmVar16[3]);
              lVar31 = sVar10 + sVar8;
              local_e8[0] = local_e8[0] & 0xffffff00;
              sVar10 = (*pWav->onWrite)(pWav->pUserData,local_e8,1);
LAB_001658bf:
              sVar10 = lVar31 + sVar10;
              goto LAB_001658e4;
            }
            if ((uVar29 & 1) == 0) goto LAB_00165910;
LAB_001658ef:
            local_e8[0] = local_e8[0] & 0xffffff00;
            sVar8 = (*pWav->onWrite)(pWav->pUserData,local_e8,1);
LAB_0016590d:
            sVar10 = sVar10 + sVar8;
          }
        }
        else if (uVar28 == 0x80) goto LAB_001655b2;
LAB_00165910:
        pmVar16 = pmVar16 + 0x1c;
        uVar30 = uVar30 - 1;
      } while (uVar30 != 0);
    }
  }
  return sVar10;
}

Assistant:

MA_PRIVATE size_t ma_dr_wav__write_or_count_metadata(ma_dr_wav* pWav, ma_dr_wav_metadata* pMetadatas, ma_uint32 metadataCount)
{
    size_t bytesWritten = 0;
    ma_bool32 hasListAdtl = MA_FALSE;
    ma_bool32 hasListInfo = MA_FALSE;
    ma_uint32 iMetadata;
    if (pMetadatas == NULL || metadataCount == 0) {
        return 0;
    }
    for (iMetadata = 0; iMetadata < metadataCount; ++iMetadata) {
        ma_dr_wav_metadata* pMetadata = &pMetadatas[iMetadata];
        ma_uint32 chunkSize = 0;
        if ((pMetadata->type & ma_dr_wav_metadata_type_list_all_info_strings) || (pMetadata->type == ma_dr_wav_metadata_type_unknown && pMetadata->data.unknown.chunkLocation == ma_dr_wav_metadata_location_inside_info_list)) {
            hasListInfo = MA_TRUE;
        }
        if ((pMetadata->type & ma_dr_wav_metadata_type_list_all_adtl) || (pMetadata->type == ma_dr_wav_metadata_type_unknown && pMetadata->data.unknown.chunkLocation == ma_dr_wav_metadata_location_inside_adtl_list)) {
            hasListAdtl = MA_TRUE;
        }
        switch (pMetadata->type) {
            case ma_dr_wav_metadata_type_smpl:
            {
                ma_uint32 iLoop;
                chunkSize = MA_DR_WAV_SMPL_BYTES + MA_DR_WAV_SMPL_LOOP_BYTES * pMetadata->data.smpl.sampleLoopCount + pMetadata->data.smpl.samplerSpecificDataSizeInBytes;
                bytesWritten += ma_dr_wav__write_or_count(pWav, "smpl", 4);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, chunkSize);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.manufacturerId);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.productId);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.samplePeriodNanoseconds);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.midiUnityNote);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.midiPitchFraction);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.smpteFormat);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.smpteOffset);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.sampleLoopCount);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.samplerSpecificDataSizeInBytes);
                for (iLoop = 0; iLoop < pMetadata->data.smpl.sampleLoopCount; ++iLoop) {
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.pLoops[iLoop].cuePointId);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.pLoops[iLoop].type);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.pLoops[iLoop].firstSampleByteOffset);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.pLoops[iLoop].lastSampleByteOffset);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.pLoops[iLoop].sampleFraction);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.pLoops[iLoop].playCount);
                }
                if (pMetadata->data.smpl.samplerSpecificDataSizeInBytes > 0) {
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.smpl.pSamplerSpecificData, pMetadata->data.smpl.samplerSpecificDataSizeInBytes);
                }
            } break;
            case ma_dr_wav_metadata_type_inst:
            {
                chunkSize = MA_DR_WAV_INST_BYTES;
                bytesWritten += ma_dr_wav__write_or_count(pWav, "inst", 4);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, chunkSize);
                bytesWritten += ma_dr_wav__write_or_count(pWav, &pMetadata->data.inst.midiUnityNote, 1);
                bytesWritten += ma_dr_wav__write_or_count(pWav, &pMetadata->data.inst.fineTuneCents, 1);
                bytesWritten += ma_dr_wav__write_or_count(pWav, &pMetadata->data.inst.gainDecibels, 1);
                bytesWritten += ma_dr_wav__write_or_count(pWav, &pMetadata->data.inst.lowNote, 1);
                bytesWritten += ma_dr_wav__write_or_count(pWav, &pMetadata->data.inst.highNote, 1);
                bytesWritten += ma_dr_wav__write_or_count(pWav, &pMetadata->data.inst.lowVelocity, 1);
                bytesWritten += ma_dr_wav__write_or_count(pWav, &pMetadata->data.inst.highVelocity, 1);
            } break;
            case ma_dr_wav_metadata_type_cue:
            {
                ma_uint32 iCuePoint;
                chunkSize = MA_DR_WAV_CUE_BYTES + MA_DR_WAV_CUE_POINT_BYTES * pMetadata->data.cue.cuePointCount;
                bytesWritten += ma_dr_wav__write_or_count(pWav, "cue ", 4);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, chunkSize);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.cue.cuePointCount);
                for (iCuePoint = 0; iCuePoint < pMetadata->data.cue.cuePointCount; ++iCuePoint) {
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.cue.pCuePoints[iCuePoint].id);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.cue.pCuePoints[iCuePoint].playOrderPosition);
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.cue.pCuePoints[iCuePoint].dataChunkId, 4);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.cue.pCuePoints[iCuePoint].chunkStart);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.cue.pCuePoints[iCuePoint].blockStart);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.cue.pCuePoints[iCuePoint].sampleByteOffset);
                }
            } break;
            case ma_dr_wav_metadata_type_acid:
            {
                chunkSize = MA_DR_WAV_ACID_BYTES;
                bytesWritten += ma_dr_wav__write_or_count(pWav, "acid", 4);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, chunkSize);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.acid.flags);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.acid.midiUnityNote);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.acid.reserved1);
                bytesWritten += ma_dr_wav__write_or_count_f32ne_to_le(pWav, pMetadata->data.acid.reserved2);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.acid.numBeats);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.acid.meterDenominator);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.acid.meterNumerator);
                bytesWritten += ma_dr_wav__write_or_count_f32ne_to_le(pWav, pMetadata->data.acid.tempo);
            } break;
            case ma_dr_wav_metadata_type_bext:
            {
                char reservedBuf[MA_DR_WAV_BEXT_RESERVED_BYTES];
                ma_uint32 timeReferenceLow;
                ma_uint32 timeReferenceHigh;
                chunkSize = MA_DR_WAV_BEXT_BYTES + pMetadata->data.bext.codingHistorySize;
                bytesWritten += ma_dr_wav__write_or_count(pWav, "bext", 4);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, chunkSize);
                bytesWritten += ma_dr_wav__write_or_count_string_to_fixed_size_buf(pWav, pMetadata->data.bext.pDescription, MA_DR_WAV_BEXT_DESCRIPTION_BYTES);
                bytesWritten += ma_dr_wav__write_or_count_string_to_fixed_size_buf(pWav, pMetadata->data.bext.pOriginatorName, MA_DR_WAV_BEXT_ORIGINATOR_NAME_BYTES);
                bytesWritten += ma_dr_wav__write_or_count_string_to_fixed_size_buf(pWav, pMetadata->data.bext.pOriginatorReference, MA_DR_WAV_BEXT_ORIGINATOR_REF_BYTES);
                bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.bext.pOriginationDate, sizeof(pMetadata->data.bext.pOriginationDate));
                bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.bext.pOriginationTime, sizeof(pMetadata->data.bext.pOriginationTime));
                timeReferenceLow  = (ma_uint32)(pMetadata->data.bext.timeReference & 0xFFFFFFFF);
                timeReferenceHigh = (ma_uint32)(pMetadata->data.bext.timeReference >> 32);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, timeReferenceLow);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, timeReferenceHigh);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.bext.version);
                bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.bext.pUMID, MA_DR_WAV_BEXT_UMID_BYTES);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.bext.loudnessValue);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.bext.loudnessRange);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.bext.maxTruePeakLevel);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.bext.maxMomentaryLoudness);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.bext.maxShortTermLoudness);
                MA_DR_WAV_ZERO_MEMORY(reservedBuf, sizeof(reservedBuf));
                bytesWritten += ma_dr_wav__write_or_count(pWav, reservedBuf, sizeof(reservedBuf));
                if (pMetadata->data.bext.codingHistorySize > 0) {
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.bext.pCodingHistory, pMetadata->data.bext.codingHistorySize);
                }
            } break;
            case ma_dr_wav_metadata_type_unknown:
            {
                if (pMetadata->data.unknown.chunkLocation == ma_dr_wav_metadata_location_top_level) {
                    chunkSize = pMetadata->data.unknown.dataSizeInBytes;
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.unknown.id, 4);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, chunkSize);
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.unknown.pData, pMetadata->data.unknown.dataSizeInBytes);
                }
            } break;
            default: break;
        }
        if ((chunkSize % 2) != 0) {
            bytesWritten += ma_dr_wav__write_or_count_byte(pWav, 0);
        }
    }
    if (hasListInfo) {
        ma_uint32 chunkSize = 4;
        for (iMetadata = 0; iMetadata < metadataCount; ++iMetadata) {
            ma_dr_wav_metadata* pMetadata = &pMetadatas[iMetadata];
            if ((pMetadata->type & ma_dr_wav_metadata_type_list_all_info_strings)) {
                chunkSize += 8;
                chunkSize += pMetadata->data.infoText.stringLength + 1;
            } else if (pMetadata->type == ma_dr_wav_metadata_type_unknown && pMetadata->data.unknown.chunkLocation == ma_dr_wav_metadata_location_inside_info_list) {
                chunkSize += 8;
                chunkSize += pMetadata->data.unknown.dataSizeInBytes;
            }
            if ((chunkSize % 2) != 0) {
                chunkSize += 1;
            }
        }
        bytesWritten += ma_dr_wav__write_or_count(pWav, "LIST", 4);
        bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, chunkSize);
        bytesWritten += ma_dr_wav__write_or_count(pWav, "INFO", 4);
        for (iMetadata = 0; iMetadata < metadataCount; ++iMetadata) {
            ma_dr_wav_metadata* pMetadata = &pMetadatas[iMetadata];
            ma_uint32 subchunkSize = 0;
            if (pMetadata->type & ma_dr_wav_metadata_type_list_all_info_strings) {
                const char* pID = NULL;
                switch (pMetadata->type) {
                    case ma_dr_wav_metadata_type_list_info_software:    pID = "ISFT"; break;
                    case ma_dr_wav_metadata_type_list_info_copyright:   pID = "ICOP"; break;
                    case ma_dr_wav_metadata_type_list_info_title:       pID = "INAM"; break;
                    case ma_dr_wav_metadata_type_list_info_artist:      pID = "IART"; break;
                    case ma_dr_wav_metadata_type_list_info_comment:     pID = "ICMT"; break;
                    case ma_dr_wav_metadata_type_list_info_date:        pID = "ICRD"; break;
                    case ma_dr_wav_metadata_type_list_info_genre:       pID = "IGNR"; break;
                    case ma_dr_wav_metadata_type_list_info_album:       pID = "IPRD"; break;
                    case ma_dr_wav_metadata_type_list_info_tracknumber: pID = "ITRK"; break;
                    default: break;
                }
                MA_DR_WAV_ASSERT(pID != NULL);
                if (pMetadata->data.infoText.stringLength) {
                    subchunkSize = pMetadata->data.infoText.stringLength + 1;
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pID, 4);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, subchunkSize);
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.infoText.pString, pMetadata->data.infoText.stringLength);
                    bytesWritten += ma_dr_wav__write_or_count_byte(pWav, '\0');
                }
            } else if (pMetadata->type == ma_dr_wav_metadata_type_unknown && pMetadata->data.unknown.chunkLocation == ma_dr_wav_metadata_location_inside_info_list) {
                if (pMetadata->data.unknown.dataSizeInBytes) {
                    subchunkSize = pMetadata->data.unknown.dataSizeInBytes;
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.unknown.id, 4);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.unknown.dataSizeInBytes);
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.unknown.pData, subchunkSize);
                }
            }
            if ((subchunkSize % 2) != 0) {
                bytesWritten += ma_dr_wav__write_or_count_byte(pWav, 0);
            }
        }
    }
    if (hasListAdtl) {
        ma_uint32 chunkSize = 4;
        for (iMetadata = 0; iMetadata < metadataCount; ++iMetadata) {
            ma_dr_wav_metadata* pMetadata = &pMetadatas[iMetadata];
            switch (pMetadata->type)
            {
                case ma_dr_wav_metadata_type_list_label:
                case ma_dr_wav_metadata_type_list_note:
                {
                    chunkSize += 8;
                    chunkSize += MA_DR_WAV_LIST_LABEL_OR_NOTE_BYTES;
                    if (pMetadata->data.labelOrNote.stringLength > 0) {
                        chunkSize += pMetadata->data.labelOrNote.stringLength + 1;
                    }
                } break;
                case ma_dr_wav_metadata_type_list_labelled_cue_region:
                {
                    chunkSize += 8;
                    chunkSize += MA_DR_WAV_LIST_LABELLED_TEXT_BYTES;
                    if (pMetadata->data.labelledCueRegion.stringLength > 0) {
                        chunkSize += pMetadata->data.labelledCueRegion.stringLength + 1;
                    }
                } break;
                case ma_dr_wav_metadata_type_unknown:
                {
                    if (pMetadata->data.unknown.chunkLocation == ma_dr_wav_metadata_location_inside_adtl_list) {
                        chunkSize += 8;
                        chunkSize += pMetadata->data.unknown.dataSizeInBytes;
                    }
                } break;
                default: break;
            }
            if ((chunkSize % 2) != 0) {
                chunkSize += 1;
            }
        }
        bytesWritten += ma_dr_wav__write_or_count(pWav, "LIST", 4);
        bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, chunkSize);
        bytesWritten += ma_dr_wav__write_or_count(pWav, "adtl", 4);
        for (iMetadata = 0; iMetadata < metadataCount; ++iMetadata) {
            ma_dr_wav_metadata* pMetadata = &pMetadatas[iMetadata];
            ma_uint32 subchunkSize = 0;
            switch (pMetadata->type)
            {
                case ma_dr_wav_metadata_type_list_label:
                case ma_dr_wav_metadata_type_list_note:
                {
                    if (pMetadata->data.labelOrNote.stringLength > 0) {
                        const char *pID = NULL;
                        if (pMetadata->type == ma_dr_wav_metadata_type_list_label) {
                            pID = "labl";
                        }
                        else if (pMetadata->type == ma_dr_wav_metadata_type_list_note) {
                            pID = "note";
                        }
                        MA_DR_WAV_ASSERT(pID != NULL);
                        MA_DR_WAV_ASSERT(pMetadata->data.labelOrNote.pString != NULL);
                        subchunkSize = MA_DR_WAV_LIST_LABEL_OR_NOTE_BYTES;
                        bytesWritten += ma_dr_wav__write_or_count(pWav, pID, 4);
                        subchunkSize += pMetadata->data.labelOrNote.stringLength + 1;
                        bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, subchunkSize);
                        bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.labelOrNote.cuePointId);
                        bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.labelOrNote.pString, pMetadata->data.labelOrNote.stringLength);
                        bytesWritten += ma_dr_wav__write_or_count_byte(pWav, '\0');
                    }
                } break;
                case ma_dr_wav_metadata_type_list_labelled_cue_region:
                {
                    subchunkSize = MA_DR_WAV_LIST_LABELLED_TEXT_BYTES;
                    bytesWritten += ma_dr_wav__write_or_count(pWav, "ltxt", 4);
                    if (pMetadata->data.labelledCueRegion.stringLength > 0) {
                        subchunkSize += pMetadata->data.labelledCueRegion.stringLength + 1;
                    }
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, subchunkSize);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.labelledCueRegion.cuePointId);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.labelledCueRegion.sampleLength);
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.labelledCueRegion.purposeId, 4);
                    bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.labelledCueRegion.country);
                    bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.labelledCueRegion.language);
                    bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.labelledCueRegion.dialect);
                    bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.labelledCueRegion.codePage);
                    if (pMetadata->data.labelledCueRegion.stringLength > 0) {
                        MA_DR_WAV_ASSERT(pMetadata->data.labelledCueRegion.pString != NULL);
                        bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.labelledCueRegion.pString, pMetadata->data.labelledCueRegion.stringLength);
                        bytesWritten += ma_dr_wav__write_or_count_byte(pWav, '\0');
                    }
                } break;
                case ma_dr_wav_metadata_type_unknown:
                {
                    if (pMetadata->data.unknown.chunkLocation == ma_dr_wav_metadata_location_inside_adtl_list) {
                        subchunkSize = pMetadata->data.unknown.dataSizeInBytes;
                        MA_DR_WAV_ASSERT(pMetadata->data.unknown.pData != NULL);
                        bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.unknown.id, 4);
                        bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, subchunkSize);
                        bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.unknown.pData, subchunkSize);
                    }
                } break;
                default: break;
            }
            if ((subchunkSize % 2) != 0) {
                bytesWritten += ma_dr_wav__write_or_count_byte(pWav, 0);
            }
        }
    }
    MA_DR_WAV_ASSERT((bytesWritten % 2) == 0);
    return bytesWritten;
}